

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O3

RangeUnit<Js::SourceFunctionNode> Js::GetFullRange<Js::SourceFunctionNode>(void)

{
  return (RangeUnit<Js::SourceFunctionNode>)(ZEXT816(0xfffffffdffffffff) << 0x40);
}

Assistant:

Js::RangeUnit<Js::SourceFunctionNode> GetFullRange()
    {
        RangeUnit<SourceFunctionNode> unit;
        unit.i.sourceContextId = 0;
        unit.j.sourceContextId = UINT_MAX;
        unit.i.functionId = 0;
        unit.j.functionId = (uint)-3;
        return unit;
    }